

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_prepare_v2(sqlite3 *db,char *zSql,int nBytes,sqlite3_stmt **ppStmt,char **pzTail)

{
  int iVar1;
  Vdbe *in_RCX;
  int in_EDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  sqlite3_stmt **in_R8;
  int rc;
  u32 in_stack_ffffffffffffffe8;
  
  iVar1 = sqlite3LockAndPrepare(in_RDI,in_RSI,in_EDX,in_stack_ffffffffffffffe8,in_RCX,in_R8,pzTail);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_prepare_v2(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  /* EVIDENCE-OF: R-37923-12173 The sqlite3_prepare_v2() interface works
  ** exactly the same as sqlite3_prepare_v3() with a zero prepFlags
  ** parameter.
  **
  ** Proof in that the 5th parameter to sqlite3LockAndPrepare is 0 */
  rc = sqlite3LockAndPrepare(db,zSql,nBytes,SQLITE_PREPARE_SAVESQL,0,
                             ppStmt,pzTail);
  assert( rc==SQLITE_OK || ppStmt==0 || *ppStmt==0 );
  return rc;
}